

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O2

void __thiscall
bitio::bitio_stream::bitio_stream
          (bitio_stream *this,string *filename,access_enum op,uint64_t buffer_size)

{
  FILE *pFVar1;
  uchar *puVar2;
  char *__modes;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  this->file = (FILE *)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->filename,filename);
  if (op == WRITE) {
    __modes = "wb";
  }
  else {
    if (op != APPEND) {
      if (op == READ) {
        pFVar1 = fopen((filename->_M_dataplus)._M_p,"rb");
        this->file = (FILE *)pFVar1;
        if (pFVar1 == (FILE *)0x0) {
          return;
        }
      }
      goto LAB_00104986;
    }
    __modes = "a";
  }
  pFVar1 = fopen((filename->_M_dataplus)._M_p,__modes);
  this->file = (FILE *)pFVar1;
LAB_00104986:
  this->buffer_size = buffer_size;
  puVar2 = (uchar *)malloc(buffer_size);
  this->byte_buffer = puVar2;
  this->bit_count = '\0';
  this->bit_buffer = '\0';
  this->byte_index = 0;
  this->current_buffer_length = 0;
  this->eof = false;
  return;
}

Assistant:

bitio_stream::bitio_stream(std::string filename, access_enum op, uint64_t buffer_size) {
    file = nullptr;
    this->filename = filename;

    if ((op == READ) && !(file = fopen(filename.c_str(), "rb"))) {
        return;
    } else if (op == WRITE) {
        file = fopen(filename.c_str(), "wb");
    } else if (op == APPEND) {
        file = fopen(filename.c_str(), "a");
    }

    this->buffer_size = buffer_size;
    byte_buffer = (unsigned char *) malloc(sizeof(unsigned char) * buffer_size);
    bit_count = 0;
    eof = false;
    bit_buffer = 0;
    current_buffer_length = 0;
    byte_index = 0;

}